

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

QMetaMethod QMetaMethod::fromSignalImpl(QMetaObject *metaObject,void **signal)

{
  StaticMetacallFunction p_Var1;
  uint *puVar2;
  QMetaObject *m;
  Data DVar3;
  long in_FS_OFFSET;
  QMetaMethod QVar4;
  int i;
  int *local_38;
  void **local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &i;
  i = -1;
  DVar3.d = (uint *)0x0;
  local_30 = signal;
  do {
    if (metaObject == (QMetaObject *)0x0) {
LAB_00261dd6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QVar4.data.d = DVar3.d;
        QVar4.mobj = metaObject;
        return QVar4;
      }
      __stack_chk_fail();
    }
    p_Var1 = (metaObject->d).static_metacall;
    if (p_Var1 != (StaticMetacallFunction)0x0) {
      (*p_Var1)((QObject *)0x0,IndexOfMethod,0,&local_38);
      if (-1 < i) {
        puVar2 = (metaObject->d).data;
        DVar3.d = puVar2 + (long)(int)puVar2[5] + (ulong)(uint)i * 6;
        goto LAB_00261dd6;
      }
    }
    metaObject = (metaObject->d).superdata.direct;
  } while( true );
}

Assistant:

QMetaMethod QMetaMethod::fromSignalImpl(const QMetaObject *metaObject, void **signal)
{
    int i = -1;
    void *args[] = { &i, signal };
    for (const QMetaObject *m = metaObject; m; m = m->d.superdata) {
        m->static_metacall(QMetaObject::IndexOfMethod, 0, args);
        if (i >= 0)
            return QMetaMethod::fromRelativeMethodIndex(m, i);
    }
    return QMetaMethod();
}